

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double bradford_cdf(double x,double a,double b,double c)

{
  double dVar1;
  undefined8 local_30;
  double cdf;
  double c_local;
  double b_local;
  double a_local;
  double x_local;
  
  local_30 = 0.0;
  if (a < x) {
    if (b < x) {
      if (b < x) {
        local_30 = 1.0;
      }
    }
    else {
      local_30 = log((c * (x - a)) / (b - a) + 1.0);
      dVar1 = log(c + 1.0);
      local_30 = local_30 / dVar1;
    }
  }
  else {
    local_30 = 0.0;
  }
  return local_30;
}

Assistant:

double bradford_cdf ( double x, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_CDF evaluates the Bradford CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Output, double BRADFORD_CDF, the value of the CDF.
//
{
  double cdf = 0.0;

  if ( x <= a )
  {
    cdf = 0.0;
  }
  else if ( x <= b )
  {
    cdf = log ( 1.0 + c * ( x - a ) / ( b - a ) ) / log ( c + 1.0 );
  }
  else if ( b < x )
  {
    cdf = 1.0;
  }

  return cdf;
}